

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  pointer puVar1;
  cmConnection *pcVar2;
  cmConnection *pcVar3;
  pointer __p;
  pointer puVar4;
  pointer __n;
  ulong uVar5;
  void *__buf;
  pointer puVar6;
  int __fd;
  long lVar7;
  ulong uVar8;
  int in_R8D;
  unique_lock<cm::shared_mutex> lock;
  unique_lock<cm::shared_mutex> local_40;
  iterator __first;
  
  local_40._M_device = &this->ConnectionsMutex;
  local_40._M_owns = false;
  std::unique_lock<cm::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar4 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar1 - (long)puVar4;
  __n = puVar4;
  uVar8 = uVar5;
  if (0 < (long)uVar5 >> 5) {
    __n = (pointer)((long)&(puVar4->_M_t).
                           super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>
                           .super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl +
                   (uVar5 & 0xffffffffffffffe0));
    lVar7 = ((long)uVar5 >> 5) + 1;
    __first._M_current = puVar4 + 2;
    do {
      if (__first._M_current[-2]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -2;
        goto LAB_003c0ffa;
      }
      if (__first._M_current[-1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -1;
        goto LAB_003c0ffa;
      }
      if (((__first._M_current)->_M_t).
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection)
      goto LAB_003c0ffa;
      if (__first._M_current[1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + 1;
        goto LAB_003c0ffa;
      }
      lVar7 = lVar7 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar7);
    uVar8 = (long)puVar1 - (long)__n;
  }
  lVar7 = (long)uVar8 >> 3;
  if (lVar7 == 1) {
LAB_003c0fde:
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = puVar1;
      __first._M_current = puVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_003c0fd5:
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = __n + 1;
      goto LAB_003c0fde;
    }
  }
  else {
    __first._M_current = puVar1;
    if (lVar7 != 3) goto LAB_003c104f;
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = __n + 1;
      goto LAB_003c0fd5;
    }
  }
LAB_003c0ffa:
  __n = (pointer)CONCAT71((int7)((ulong)__n >> 8),__first._M_current == puVar1);
  puVar6 = __first._M_current + 1;
  if (puVar6 != puVar1 && __first._M_current != puVar1) {
    do {
      pcVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
      if (pcVar2 != pConnection) {
        (puVar6->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = (cmConnection *)0x0;
        pcVar3 = ((__first._M_current)->_M_t).
                 super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                 super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                 super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
        ((__first._M_current)->_M_t).
        super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = pcVar2;
        if (pcVar3 != (cmConnection *)0x0) {
          (*pcVar3->_vptr_cmConnection[2])();
        }
        __first._M_current = __first._M_current + 1;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    puVar4 = (this->Connections).
             super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->Connections).
                  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  }
LAB_003c104f:
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::_M_erase(&this->Connections,__first,
             (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
             ((long)&(puVar4->_M_t).
                     super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                     super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                     super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl + uVar5));
  __fd = (int)__first._M_current;
  std::unique_lock<cm::shared_mutex>::~unique_lock(&local_40);
  if ((this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::cm::uv_async_ptr::send(&this->ShutdownSignal,__fd,__buf,(size_t)__n,in_R8D);
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    Connections.erase(
      std::remove_if(Connections.begin(), Connections.end(), pred),
      Connections.end());
  }

  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}